

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

void __thiscall sznet::net::Connector::restart(Connector *this)

{
  EventLoop *this_00;
  bool bVar1;
  
  this_00 = this->m_loop;
  bVar1 = EventLoop::isInLoopThread(this_00);
  if (!bVar1) {
    EventLoop::abortNotInLoopThread(this_00);
  }
  this->m_state = kDisconnected;
  this->m_retryDelayMs = 500;
  this->m_connect = true;
  startInLoop(this);
  return;
}

Assistant:

void Connector::restart()
{
	m_loop->assertInLoopThread();
	setState(kDisconnected);
	m_retryDelayMs = kInitRetryDelayMs;
	m_connect = true;
	startInLoop();
}